

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

void processColumnNoise(double *out,SeaLevelColumnNoiseBeta *src,double *climate)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double dVar1;
  double contB;
  double contA;
  double humi;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int local_4c;
  double sSample;
  double hSample;
  double lSample;
  double procCont;
  double chooseLHS;
  int i;
  double *selector;
  double *high;
  double *low;
  
  dVar1 = -*in_RDX * in_RDX[1] + 1.0;
  dVar1 = dVar1 * dVar1;
  local_80 = ((*in_RSI + 256.0) / 512.0) * (1.0 - dVar1 * dVar1);
  if (1.0 < local_80) {
    local_80 = 1.0;
  }
  chooseLHS = local_80;
  procCont = in_RSI[1] / 8000.0;
  if (procCont < 0.0) {
    procCont = -procCont * 0.3;
  }
  local_90 = procCont * 3.0 + -2.0;
  if (0.0 <= local_90) {
    if (local_90 <= 1.0) {
      local_90 = local_90 / 8.0;
    }
    else {
      local_90 = 0.125;
    }
    procCont = local_90;
  }
  else {
    if (-1.0 <= local_90 / 2.0) {
      local_88 = ((local_90 / 2.0) / 1.4) / 2.0;
    }
    else {
      local_88 = -0.35714285714285715;
    }
    procCont = local_88;
    chooseLHS = 0.0;
  }
  if (0.0 <= chooseLHS) {
    local_98 = chooseLHS + 0.5;
  }
  else {
    local_98 = 0.5;
  }
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    local_a0 = (((double)(local_4c + 7) - (((procCont * 17.0) / 16.0) * 4.0 + 8.5)) * 12.0) /
               local_98;
    if (local_a0 < 0.0) {
      local_a0 = local_a0 * 4.0;
    }
    local_a8 = in_RSI[(long)local_4c + 2] / 512.0;
    local_b0 = in_RSI[(long)local_4c + 4] / 512.0;
    dVar1 = (in_RSI[(long)local_4c + 6] / 10.0 + 1.0) / 2.0;
    if (0.0 <= dVar1) {
      if (dVar1 <= 1.0) {
        local_b0 = (local_b0 - local_a8) * dVar1 + local_a8;
      }
      local_a8 = local_b0;
    }
    *(double *)(in_RDI + (long)local_4c * 8) = local_a8 - local_a0;
  }
  return;
}

Assistant:

static void processColumnNoise(double *out, const SeaLevelColumnNoiseBeta *src,
    const double climate[2])
{
    double humi = 1 - climate[0] * climate[1];
    humi *= humi;
    humi *= humi;
    humi = 1 - humi;
    double contA = (src->contASample + 256) / 512 * humi;
    contA = (contA > 1) ? 1.0 : contA;
    double contB = src->contBSample / 8000;
    if (contB < 0)
        contB = -contB * 0.3;
    contB = contB*3-2;
    if (contB < 0)
    {
        contB /= 2;
        contB = (contB < -1) ? -1.0 / 1.4 / 2 : contB / 1.4 / 2;
        contA = 0;
    }
    else
    {
        contB = (contB > 1) ? 1.0/8 : contB/8;
    }
    contA = (contA < 0) ? 0.5 : contA+0.5;
    contB = (contB * 17.0) / 16;
    contB = 17.0 / 2 + contB * 4;
    const double *low = src->minSample;
    const double *high = src->maxSample;
    const double *selector = src->mainSample;
    int i;
    for (i = 0; i <= 1; i++)
    {
        double chooseLHS;
        double procCont = ((i + 7 - contB) * 12) / contA;
        procCont = (procCont < 0) ? procCont*4 : procCont;
        double lSample = low[i] / 512;
        double hSample = high[i] / 512;
        double sSample = (selector[i] / 10 + 1) / 2;
        chooseLHS = (sSample < 0.0) ? lSample : (sSample > 1) ? hSample :
            lSample + (hSample - lSample) * sSample;
        chooseLHS -= procCont;
        out[i] = chooseLHS;
    }
}